

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

Matrix * __thiscall Matrix::operator+(Matrix *__return_storage_ptr__,Matrix *this,Matrix *mat)

{
  Shape *shape;
  pointer pvVar1;
  pointer pvVar2;
  pointer pvVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  
  if (((this->m_shape).field_0.m_dims[0] == (mat->m_shape).field_0.m_dims[0]) &&
     ((this->m_shape).field_0.m_dims[1] == (mat->m_shape).field_0.m_dims[1])) {
    shape = &this->m_shape;
    Matrix(__return_storage_ptr__,shape);
    uVar8 = (shape->field_0).m_dims[0];
    if (uVar8 != 0) {
      pvVar1 = (this->m_vals).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar2 = (mat->m_vals).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar3 = (__return_storage_ptr__->m_vals).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = (ulong)(this->m_shape).field_0.m_dims[1];
      uVar7 = 0;
      do {
        iVar9 = (int)uVar10;
        uVar10 = 0;
        if (iVar9 != 0) {
          lVar4 = *(long *)&pvVar1[uVar7].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl;
          lVar5 = *(long *)&pvVar2[uVar7].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl;
          lVar6 = *(long *)&pvVar3[uVar7].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl;
          uVar11 = 0;
          do {
            *(double *)(lVar6 + uVar11 * 8) =
                 *(double *)(lVar4 + uVar11 * 8) + *(double *)(lVar5 + uVar11 * 8);
            uVar11 = uVar11 + 1;
            uVar10 = (ulong)(this->m_shape).field_0.m_dims[1];
          } while (uVar11 < uVar10);
          uVar8 = (shape->field_0).m_dims[0];
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < uVar8);
    }
    return __return_storage_ptr__;
  }
  std::operator<<((ostream *)&std::cout,"ERROR [+ operator]: Shape doesn\'t match!\n");
  exit(1);
}

Assistant:

bool Shape::operator==(const Shape& shape) const{
    return (n_row==shape.n_row && n_col==shape.n_col);
}